

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HtmlBuilder.h
# Opt level: O3

TD * __thiscall HTML::TD::align(TD *this,string *value)

{
  ostream *poVar1;
  
  poVar1 = (this->super_TAG).m_stream;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," align=\'",8);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(value->_M_dataplus)._M_p,value->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\'",1);
  return this;
}

Assistant:

TD &align(const std::string &value) {
    m_stream << " align='" << value << "'";
    return *this;
  }